

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

qpdf_oh qpdf_get_page_n(qpdf_data qpdf,size_t i)

{
  size_t qpdf_00;
  uint uVar1;
  anon_class_16_2_196927f7 local_58;
  function<void_(_qpdf_data_*)> local_48;
  uint local_28;
  qpdf_oh local_24;
  QPDF_ERROR_CODE code;
  qpdf_oh result;
  size_t i_local;
  qpdf_data qpdf_local;
  
  _code = i;
  i_local = (size_t)qpdf;
  QTC::TC("qpdf","qpdf-c called qpdf_get_page_n",0);
  qpdf_00 = i_local;
  local_24 = 0;
  local_58.result = &local_24;
  local_58.i = _code;
  std::function<void(_qpdf_data*)>::function<qpdf_get_page_n::__0,void>
            ((function<void(_qpdf_data*)> *)&local_48,&local_58);
  uVar1 = trap_errors((qpdf_data)qpdf_00,&local_48);
  std::function<void_(_qpdf_data_*)>::~function(&local_48);
  if (((uVar1 & 2) == 0) && (local_24 != 0)) {
    qpdf_local._4_4_ = local_24;
  }
  else {
    local_28 = uVar1;
    qpdf_local._4_4_ = qpdf_oh_new_uninitialized((qpdf_data)i_local);
  }
  return qpdf_local._4_4_;
}

Assistant:

qpdf_oh
qpdf_get_page_n(qpdf_data qpdf, size_t i)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_get_page_n");
    qpdf_oh result = 0;
    QPDF_ERROR_CODE code = trap_errors(
        qpdf, [&result, i](qpdf_data q) { result = new_object(q, q->qpdf->getAllPages().at(i)); });
    if ((code & QPDF_ERRORS) || (result == 0)) {
        return qpdf_oh_new_uninitialized(qpdf);
    }
    return result;
}